

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatterATT.c
# Opt level: O3

ZyanStatus
ZydisFormatterATTPrintAddressABS
          (ZydisFormatter *formatter,ZydisFormatterBuffer *buffer,ZydisFormatterContext *context)

{
  void **ppvVar1;
  ZyanUSize ZVar2;
  void *pvVar3;
  ZyanStatus ZVar4;
  ulong uVar5;
  
  if (formatter == (ZydisFormatter *)0x0) {
    __assert_fail("formatter",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/FormatterATT.c"
                  ,0x170,
                  "ZyanStatus ZydisFormatterATTPrintAddressABS(const ZydisFormatter *, ZydisFormatterBuffer *, ZydisFormatterContext *)"
                 );
  }
  if (buffer == (ZydisFormatterBuffer *)0x0) {
    __assert_fail("buffer",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/FormatterATT.c"
                  ,0x171,
                  "ZyanStatus ZydisFormatterATTPrintAddressABS(const ZydisFormatter *, ZydisFormatterBuffer *, ZydisFormatterContext *)"
                 );
  }
  if (context == (ZydisFormatterContext *)0x0) {
    __assert_fail("context",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/FormatterATT.c"
                  ,0x172,
                  "ZyanStatus ZydisFormatterATTPrintAddressABS(const ZydisFormatter *, ZydisFormatterBuffer *, ZydisFormatterContext *)"
                 );
  }
  if (((context->instruction->meta).branch_type != ZYDIS_BRANCH_TYPE_NONE) &&
     (context->operand->type == ZYDIS_OPERAND_TYPE_MEMORY)) {
    if (buffer->is_token_list == '\0') {
      if ((buffer->string).vector.allocator != (ZyanAllocator *)0x0) {
        __assert_fail("!destination->vector.allocator",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/include/Zydis/Internal/String.h"
                      ,0xeb,
                      "ZyanStatus ZydisStringAppendShort(ZyanString *, const ZydisShortString *)");
      }
      ZVar2 = (buffer->string).vector.size;
      if (ZVar2 == 0) {
        __assert_fail("destination->vector.size && source->size",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/include/Zydis/Internal/String.h"
                      ,0xec,
                      "ZyanStatus ZydisStringAppendShort(ZyanString *, const ZydisShortString *)");
      }
      if ((buffer->string).vector.capacity < ZVar2 + 1) {
        return 0x80100009;
      }
      *(undefined2 *)((long)(buffer->string).vector.data + (ZVar2 - 1)) = 0x2a;
      ZVar2 = (buffer->string).vector.size;
      pvVar3 = (buffer->string).vector.data;
      (buffer->string).vector.size = ZVar2 + 1;
      if (*(char *)((long)pvVar3 + ZVar2) != '\0') {
        __assert_fail("*(char*)((ZyanU8*)(destination)->vector.data + (destination)->vector.size - 1) == \'\\0\'"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/include/Zydis/Internal/String.h"
                      ,0xf7,
                      "ZyanStatus ZydisStringAppendShort(ZyanString *, const ZydisShortString *)");
      }
    }
    else {
      ZVar2 = (buffer->string).vector.size;
      if (0xfe < ZVar2 - 1) {
        __assert_fail("(len > 0) && (len < 256)",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/include/Zydis/Internal/FormatterBase.h"
                      ,0xe7,
                      "ZyanStatus ZydisFormatterBufferAppendPredefined(ZydisFormatterBuffer *, const ZydisPredefinedToken *)"
                     );
      }
      if (buffer->capacity <= ZVar2 + 4) {
        return 0x80100009;
      }
      pvVar3 = (buffer->string).vector.data;
      *(char *)((long)pvVar3 + -1) = (char)ZVar2;
      *(undefined4 *)((long)pvVar3 + ZVar2) = 0x2a0002;
      uVar5 = buffer->capacity - (ZVar2 + 2);
      buffer->capacity = uVar5;
      ppvVar1 = &(buffer->string).vector.data;
      *ppvVar1 = (void *)((long)*ppvVar1 + ZVar2 + 2);
      (buffer->string).vector.size = 2;
      if (0xfe < uVar5) {
        uVar5 = 0xff;
      }
      (buffer->string).vector.capacity = uVar5;
    }
  }
  ZVar4 = ZydisFormatterBasePrintAddressABS(formatter,buffer,context);
  return ZVar4;
}

Assistant:

ZyanStatus ZydisFormatterATTPrintAddressABS(const ZydisFormatter* formatter,
    ZydisFormatterBuffer* buffer, ZydisFormatterContext* context)
{
    ZYAN_ASSERT(formatter);
    ZYAN_ASSERT(buffer);
    ZYAN_ASSERT(context);

    if ((context->instruction->meta.branch_type != ZYDIS_BRANCH_TYPE_NONE) &&
        (context->operand->type == ZYDIS_OPERAND_TYPE_MEMORY))
    {
        ZYDIS_BUFFER_APPEND(buffer, MUL);
    }

    return ZydisFormatterBasePrintAddressABS(formatter, buffer, context);
}